

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_min.hpp
# Opt level: O2

__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
burst::
select_min<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<void>>
          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,int *last)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  bool bVar7;
  
  piVar6 = first._M_current;
  piVar4 = first._M_current;
  if (first._M_current != last) {
    while (piVar3 = piVar6, piVar6 = piVar3 + 1, piVar6 != last) {
      iVar1 = *piVar6;
      piVar5 = first._M_current;
      if ((iVar1 < *piVar4) ||
         ((iVar1 <= *piVar4 &&
          (bVar7 = piVar3 != piVar4, piVar5 = piVar4 + 1, piVar4 = piVar4 + 1, bVar7)))) {
        iVar2 = *piVar5;
        *piVar5 = iVar1;
        *piVar6 = iVar2;
        piVar4 = piVar5;
      }
    }
    first._M_current = piVar4 + 1;
  }
  return (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)first._M_current;
}

Assistant:

auto select_min (ForwardIterator first, ForwardIterator last, BinaryPredicate compare)
    {
        if (first != last)
        {
            auto min = first;

            for (auto current = std::next(first); current != last; ++current)
            {
                if (compare(*current, *min))
                {
                    std::iter_swap(first, current);
                    min = first;
                }
                else if (not compare(*min, *current))
                {
                    ++min;
                    if (min != current)
                    {
                        std::iter_swap(min, current);
                    }
                }
            }

            return ++min;
        }

        return first;
    }